

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

spv_result_t
spvValidateWithOptions
          (spv_const_context context,spv_const_validator_options options,spv_const_binary binary,
          spv_diagnostic *pDiagnostic)

{
  MessageConsumer *pMVar1;
  _Manager_type p_Var2;
  spv_result_t sVar3;
  ValidationState_t vstate;
  spv_context_t local_798;
  ValidationState_t local_758;
  
  local_798.target_env = context->target_env;
  local_798._4_4_ = *(undefined4 *)&context->field_0x4;
  local_798.opcode_table = context->opcode_table;
  local_798.operand_table._0_4_ = *(undefined4 *)&context->operand_table;
  local_798.operand_table._4_4_ = *(undefined4 *)((long)&context->operand_table + 4);
  local_798.ext_inst_table._0_4_ = *(undefined4 *)&context->ext_inst_table;
  local_798.ext_inst_table._4_4_ = *(undefined4 *)((long)&context->ext_inst_table + 4);
  pMVar1 = &local_798.consumer;
  local_798.consumer.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_798.consumer.super__Function_base._M_functor._8_8_ = 0;
  local_798.consumer.super__Function_base._M_manager = (_Manager_type)0x0;
  local_798.consumer._M_invoker = (_Invoker_type)0x0;
  p_Var2 = (context->consumer).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)pMVar1,(_Any_data *)&context->consumer,__clone_functor);
    local_798.consumer.super__Function_base._M_manager =
         (context->consumer).super__Function_base._M_manager;
    local_798.consumer._M_invoker = (context->consumer)._M_invoker;
  }
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer(&local_798,pDiagnostic);
  }
  spvtools::val::ValidationState_t::ValidationState_t
            (&local_758,&local_798,options,binary->code,binary->wordCount,1);
  sVar3 = spvtools::val::anon_unknown_2::ValidateBinaryUsingContextAndValidationState
                    (&local_798,binary->code,binary->wordCount,pDiagnostic,&local_758);
  spvtools::val::ValidationState_t::~ValidationState_t(&local_758);
  if (local_798.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_798.consumer.super__Function_base._M_manager)
              ((_Any_data *)pMVar1,(_Any_data *)pMVar1,__destroy_functor);
  }
  return sVar3;
}

Assistant:

spv_result_t spvValidateWithOptions(const spv_const_context context,
                                    spv_const_validator_options options,
                                    const spv_const_binary binary,
                                    spv_diagnostic* pDiagnostic) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  // Create the ValidationState using the context.
  spvtools::val::ValidationState_t vstate(&hijack_context, options,
                                          binary->code, binary->wordCount,
                                          kDefaultMaxNumOfWarnings);

  return spvtools::val::ValidateBinaryUsingContextAndValidationState(
      hijack_context, binary->code, binary->wordCount, pDiagnostic, &vstate);
}